

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O0

_Bool Curl_bufq_is_full(bufq *q)

{
  bufq *q_local;
  
  if ((q->tail == (buf_chunk *)0x0) || (q->spare != (buf_chunk *)0x0)) {
    q_local._7_1_ = false;
  }
  else if (q->chunk_count < q->max_chunks) {
    q_local._7_1_ = false;
  }
  else if (q->max_chunks < q->chunk_count) {
    q_local._7_1_ = true;
  }
  else {
    q_local._7_1_ = chunk_is_full(q->tail);
  }
  return q_local._7_1_;
}

Assistant:

bool Curl_bufq_is_full(const struct bufq *q)
{
  if(!q->tail || q->spare)
    return FALSE;
  if(q->chunk_count < q->max_chunks)
    return FALSE;
  if(q->chunk_count > q->max_chunks)
    return TRUE;
  /* we have no spares and cannot make more, is the tail full? */
  return chunk_is_full(q->tail);
}